

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_builder.h
# Opt level: O2

MyGame_Example_Monster_ref_t
MyGame_Example_Monster_clone(flatbuffers_builder_t *B,MyGame_Example_Monster_table_t t)

{
  uint uVar1;
  flatcc_builder_ref_t fVar2;
  int iVar3;
  flatbuffers_uint8_vec_ref_t fVar4;
  flatbuffers_string_vec_ref_t fVar5;
  MyGame_Example_Monster_ref_t MVar6;
  MyGame_Example_Test_vec_ref_t MVar7;
  flatbuffers_string_ref_t ref;
  MyGame_Example_Stat_ref_t MVar8;
  long lVar9;
  void *pvVar10;
  flatbuffers_string_t string;
  ulong uVar11;
  MyGame_Example_Monster_vec_t vec;
  flatcc_builder_ref_t *pfVar12;
  MyGame_Example_Any_union_ref_t uref;
  ushort uVar13;
  size_t i;
  MyGame_Example_Monster_table_t pMVar14;
  MyGame_Example_Any_union_t MVar15;
  MyGame_Example_Any_union_t u;
  
  fVar2 = flatcc_builder_refmap_find(B,t);
  if (fVar2 != 0) {
    return fVar2;
  }
  iVar3 = MyGame_Example_Monster_start(B);
  if (iVar3 != 0) {
    return 0;
  }
  if (t == (MyGame_Example_Monster_table_t)0x0) {
    __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_reader.h"
                  ,0x43d,
                  "MyGame_Example_Vec3_struct_t MyGame_Example_Monster_pos_get(MyGame_Example_Monster_table_t)"
                 );
  }
  lVar9 = -(long)*(int *)t;
  if ((5 < *(ushort *)(t + -(long)*(int *)t)) && (*(ushort *)(t + lVar9 + 4) != 0)) {
    iVar3 = MyGame_Example_Monster_pos_clone
                      (B,(MyGame_Example_Vec3_struct_t)(t + *(ushort *)(t + lVar9 + 4)));
    if (iVar3 != 0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x29 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x28) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,0x12,t + *(ushort *)(t + lVar9 + 0x28),8,8);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x2b < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x2a) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,0x13,t + *(ushort *)(t + lVar9 + 0x2a),8,8);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x31 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x30) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,0x16,t + *(ushort *)(t + lVar9 + 0x30),8,8);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if (((0x33 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x32) != 0)) &&
     (pvVar10 = flatcc_builder_table_add_copy(B,0x17,t + *(ushort *)(t + lVar9 + 0x32),8,8),
     pvVar10 == (void *)0x0)) {
    return 0;
  }
  string = MyGame_Example_Monster_name_get(t);
  iVar3 = MyGame_Example_Monster_name_clone(B,string);
  if (iVar3 != 0) {
    return 0;
  }
  if ((0xf < *(ushort *)(t + -(long)*(int *)t)) &&
     (uVar11 = (ulong)*(ushort *)(t + (0xe - (long)*(int *)t)), uVar11 != 0)) {
    fVar4 = flatbuffers_uint8_vec_clone(B,&t[*(uint *)(t + uVar11) + uVar11 + 4].unused__);
    iVar3 = MyGame_Example_Monster_inventory_add(B,fVar4);
    if (iVar3 != 0) {
      return 0;
    }
  }
  vec = MyGame_Example_Monster_testarrayoftables_get(t);
  if (vec != (MyGame_Example_Monster_vec_t)0x0) {
    fVar2 = flatcc_builder_refmap_find(B,vec);
    if (fVar2 == 0) {
      uVar1 = vec[-1];
      iVar3 = flatcc_builder_start_offset_vector(B);
      fVar2 = 0;
      if (iVar3 == 0) {
        i = 0;
        do {
          if (uVar1 == i) {
            fVar2 = flatcc_builder_end_offset_vector(B);
            fVar2 = flatcc_builder_refmap_insert(B,vec,fVar2);
            break;
          }
          pMVar14 = MyGame_Example_Monster_vec_at(vec,i);
          MVar6 = MyGame_Example_Monster_clone(B,pMVar14);
          fVar2 = 0;
          if (MVar6 == 0) break;
          pfVar12 = flatcc_builder_offset_vector_push(B,MVar6);
          i = i + 1;
          fVar2 = 0;
        } while (pfVar12 != (flatcc_builder_ref_t *)0x0);
      }
    }
    iVar3 = MyGame_Example_Monster_testarrayoftables_add(B,fVar2);
    if (iVar3 != 0) {
      return 0;
    }
  }
  lVar9 = -(long)*(int *)t;
  if ((0x19 < *(ushort *)(t + -(long)*(int *)t)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x18), uVar11 != 0)) {
    fVar5 = flatbuffers_string_vec_clone
                      (B,(flatbuffers_string_vec_t)(t + *(uint *)(t + uVar11) + uVar11 + 4));
    iVar3 = MyGame_Example_Monster_testarrayofstring_add(B,fVar5);
    if (iVar3 != 0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x3d < *(ushort *)(t + lVar9)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x3c), uVar11 != 0)) {
    fVar5 = flatbuffers_string_vec_clone
                      (B,(flatbuffers_string_vec_t)(t + *(uint *)(t + uVar11) + uVar11 + 4));
    if (fVar5 == 0) {
      return 0;
    }
    pfVar12 = flatcc_builder_table_add_offset(B,0x1c);
    if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
      return 0;
    }
    *pfVar12 = fVar5;
    lVar9 = -(long)*(int *)t;
  }
  if ((0x35 < *(ushort *)(t + lVar9)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x34), uVar11 != 0)) {
    iVar3 = MyGame_Example_Monster_testarrayofbools_clone
                      (B,&t[*(uint *)(t + uVar11) + uVar11 + 4].unused__);
    if (iVar3 != 0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x3f < *(ushort *)(t + lVar9)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x3e), uVar11 != 0)) {
    uVar1 = *(uint *)(t + uVar11);
    pMVar14 = t + uVar1 + uVar11 + 4;
    fVar2 = flatcc_builder_refmap_find(B,pMVar14);
    if (fVar2 == 0) {
      fVar2 = flatcc_builder_create_vector
                        (B,pMVar14,(ulong)*(uint *)(t + uVar1 + uVar11),8,4,0x1fffffff);
      fVar2 = flatcc_builder_refmap_insert(B,pMVar14,fVar2);
      if (fVar2 == 0) {
        return 0;
      }
    }
    pfVar12 = flatcc_builder_table_add_offset(B,0x1d);
    if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
      return 0;
    }
    *pfVar12 = fVar2;
  }
  pMVar14 = MyGame_Example_Monster_enemy_get(t);
  if (pMVar14 != (MyGame_Example_Monster_table_t)0x0) {
    MVar6 = MyGame_Example_Monster_clone(B,pMVar14);
    iVar3 = MyGame_Example_Monster_enemy_add(B,MVar6);
    if (iVar3 != 0) {
      return 0;
    }
  }
  MVar15 = MyGame_Example_Monster_test_union(t);
  u.value = MVar15.value;
  if (MVar15.type != 0) {
    u._1_7_ = 0;
    u.type = MVar15.type;
    uref = MyGame_Example_Any_clone(B,u);
    iVar3 = MyGame_Example_Monster_test_add(B,uref);
    if (iVar3 != 0) {
      return 0;
    }
  }
  lVar9 = -(long)*(int *)t;
  if ((0x17 < *(ushort *)(t + -(long)*(int *)t)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x16), uVar11 != 0)) {
    iVar3 = MyGame_Example_Monster_test4_clone
                      (B,(MyGame_Example_Test_vec_t)(t + *(uint *)(t + uVar11) + uVar11 + 4));
    if (iVar3 != 0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x43 < *(ushort *)(t + lVar9)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x42), uVar11 != 0)) {
    MVar7 = MyGame_Example_Test_vec_clone
                      (B,(MyGame_Example_Test_vec_t)(t + *(uint *)(t + uVar11) + uVar11 + 4));
    if (MVar7 == 0) {
      return 0;
    }
    pfVar12 = flatcc_builder_table_add_offset(B,0x1f);
    if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
      return 0;
    }
    *pfVar12 = MVar7;
    lVar9 = -(long)*(int *)t;
  }
  if ((0x1f < *(ushort *)(t + lVar9)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x1e), uVar11 != 0)) {
    fVar4 = flatbuffers_uint8_vec_clone(B,&t[*(uint *)(t + uVar11) + uVar11 + 4].unused__);
    iVar3 = MyGame_Example_Monster_testnestedflatbuffer_add(B,fVar4);
    if (iVar3 != 0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((*(ushort *)(t + lVar9) < 0x22) ||
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x20), uVar11 == 0)) goto LAB_0010bb75;
  pMVar14 = t + *(uint *)(t + uVar11) + uVar11;
  fVar2 = flatcc_builder_refmap_find(B,pMVar14);
  if (fVar2 == 0) {
    iVar3 = MyGame_Example_Stat_start(B);
    MVar8 = 0;
    fVar2 = 0;
    if (iVar3 == 0) {
      lVar9 = -(long)*(int *)pMVar14;
      uVar13 = *(ushort *)(pMVar14 + -(long)*(int *)pMVar14);
      fVar2 = MVar8;
      if (uVar13 < 8) {
LAB_0010bad3:
        if (5 < uVar13) goto LAB_0010bad9;
      }
      else {
        if (*(ushort *)(pMVar14 + lVar9 + 6) != 0) {
          pvVar10 = flatcc_builder_table_add_copy
                              (B,1,pMVar14 + *(ushort *)(pMVar14 + lVar9 + 6),8,8);
          if (pvVar10 == (void *)0x0) goto LAB_0010bb5d;
          lVar9 = -(long)*(int *)pMVar14;
          uVar13 = *(ushort *)(pMVar14 + -(long)*(int *)pMVar14);
          goto LAB_0010bad3;
        }
LAB_0010bad9:
        uVar11 = (ulong)*(ushort *)(pMVar14 + lVar9 + 4);
        if (uVar11 != 0) {
          ref = flatbuffers_string_clone
                          (B,(flatbuffers_string_t)
                             (pMVar14 + *(uint *)(pMVar14 + uVar11) + uVar11 + 4));
          iVar3 = MyGame_Example_Stat_id_add(B,ref);
          if (iVar3 != 0) goto LAB_0010bb5d;
          lVar9 = -(long)*(int *)pMVar14;
          uVar13 = *(ushort *)(pMVar14 + -(long)*(int *)pMVar14);
        }
        if (((9 < uVar13) && (*(ushort *)(pMVar14 + lVar9 + 8) != 0)) &&
           (pvVar10 = flatcc_builder_table_add_copy
                                (B,2,pMVar14 + *(ushort *)(pMVar14 + lVar9 + 8),2,2),
           pvVar10 == (void *)0x0)) goto LAB_0010bb5d;
      }
      MVar8 = MyGame_Example_Stat_end(B);
      fVar2 = flatcc_builder_refmap_insert(B,pMVar14,MVar8);
    }
  }
LAB_0010bb5d:
  iVar3 = MyGame_Example_Monster_testempty_add(B,fVar2);
  if (iVar3 != 0) {
    return 0;
  }
  lVar9 = -(long)*(int *)t;
LAB_0010bb75:
  if ((0x25 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x24) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,0x10,t + *(ushort *)(t + lVar9 + 0x24),4,4);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x27 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x26) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,0x11,t + *(ushort *)(t + lVar9 + 0x26),4,4);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x2d < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x2c) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,0x14,t + *(ushort *)(t + lVar9 + 0x2c),4,4);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x2f < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x2e) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,0x15,t + *(ushort *)(t + lVar9 + 0x2e),4,4);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x37 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x36) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,0x19,t + *(ushort *)(t + lVar9 + 0x36),4,4);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x39 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x38) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,0x1a,t + *(ushort *)(t + lVar9 + 0x38),4,4);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x3b < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x3a) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,0x1b,t + *(ushort *)(t + lVar9 + 0x3a),4,4);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x41 < *(ushort *)(t + lVar9)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x40), uVar11 != 0)) {
    fVar4 = flatbuffers_uint8_vec_clone(B,&t[*(uint *)(t + uVar11) + uVar11 + 4].unused__);
    if (fVar4 == 0) {
      return 0;
    }
    pfVar12 = flatcc_builder_table_add_offset(B,0x1e);
    if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
      return 0;
    }
    *pfVar12 = fVar4;
    lVar9 = -(long)*(int *)t;
  }
  if ((0x45 < *(ushort *)(t + lVar9)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x44), uVar11 != 0)) {
    uVar1 = *(uint *)(t + uVar11);
    pMVar14 = t + uVar1 + uVar11 + 4;
    fVar2 = flatcc_builder_refmap_find(B,pMVar14);
    if (fVar2 == 0) {
      fVar2 = flatcc_builder_create_vector
                        (B,pMVar14,(ulong)*(uint *)(t + uVar1 + uVar11),8,8,0x1fffffff);
      fVar2 = flatcc_builder_refmap_insert(B,pMVar14,fVar2);
      if (fVar2 == 0) {
        return 0;
      }
    }
    pfVar12 = flatcc_builder_table_add_offset(B,0x20);
    if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
      return 0;
    }
    *pfVar12 = fVar2;
    lVar9 = -(long)*(int *)t;
  }
  if ((0x47 < *(ushort *)(t + lVar9)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x46), uVar11 != 0)) {
    uVar1 = *(uint *)(t + uVar11);
    pMVar14 = t + uVar1 + uVar11 + 4;
    fVar2 = flatcc_builder_refmap_find(B,pMVar14);
    if (fVar2 == 0) {
      fVar2 = flatcc_builder_create_vector
                        (B,pMVar14,(ulong)*(uint *)(t + uVar1 + uVar11),8,8,0x1fffffff);
      fVar2 = flatcc_builder_refmap_insert(B,pMVar14,fVar2);
      if (fVar2 == 0) {
        return 0;
      }
    }
    pfVar12 = flatcc_builder_table_add_offset(B,0x21);
    if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
      return 0;
    }
    *pfVar12 = fVar2;
    lVar9 = -(long)*(int *)t;
  }
  if ((0x49 < *(ushort *)(t + lVar9)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x48), uVar11 != 0)) {
    uVar1 = *(uint *)(t + uVar11);
    fVar2 = flatcc_builder_refmap_find(B,t + uVar1 + uVar11);
    if (fVar2 == 0) {
      iVar3 = flatcc_builder_start_table(B,0);
      if (iVar3 != 0) {
        return 0;
      }
      iVar3 = flatcc_builder_check_required(B,__MyGame_InParentNamespace_required,0);
      if (iVar3 == 0) {
        __assert_fail("flatcc_builder_check_required(B, __MyGame_InParentNamespace_required, sizeof(__MyGame_InParentNamespace_required) / sizeof(__MyGame_InParentNamespace_required[0]) - 1)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_builder.h"
                      ,0x103,
                      "MyGame_InParentNamespace_ref_t MyGame_InParentNamespace_end(flatbuffers_builder_t *)"
                     );
      }
      fVar2 = flatcc_builder_end_table(B);
      fVar2 = flatcc_builder_refmap_insert(B,t + uVar1 + uVar11,fVar2);
      if (fVar2 == 0) {
        return 0;
      }
    }
    pfVar12 = flatcc_builder_table_add_offset(B,0x22);
    if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
      return 0;
    }
    *pfVar12 = fVar2;
    lVar9 = -(long)*(int *)t;
  }
  if ((0x4b < *(ushort *)(t + lVar9)) &&
     (uVar11 = (ulong)*(ushort *)(t + lVar9 + 0x4a), uVar11 != 0)) {
    pMVar14 = t + *(uint *)(t + uVar11) + uVar11;
    fVar2 = flatcc_builder_refmap_find(B,pMVar14);
    if (fVar2 == 0) {
      iVar3 = flatcc_builder_start_table(B,3);
      if (iVar3 != 0) {
        return 0;
      }
      uVar13 = *(ushort *)(pMVar14 + -(long)*(int *)pMVar14);
      if (5 < uVar13) {
        lVar9 = -(long)*(int *)pMVar14;
        uVar11 = (ulong)*(ushort *)(pMVar14 + lVar9 + 4);
        if (uVar11 != 0) {
          fVar4 = flatbuffers_uint8_vec_clone
                            (B,&pMVar14[*(uint *)(pMVar14 + uVar11) + uVar11 + 4].unused__);
          if (fVar4 == 0) {
            return 0;
          }
          pfVar12 = flatcc_builder_table_add_offset(B,0);
          if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
            return 0;
          }
          *pfVar12 = fVar4;
          lVar9 = -(long)*(int *)pMVar14;
          uVar13 = *(ushort *)(pMVar14 + -(long)*(int *)pMVar14);
        }
        if (7 < uVar13) {
          uVar11 = (ulong)*(ushort *)(pMVar14 + lVar9 + 6);
          if (uVar11 != 0) {
            fVar4 = flatbuffers_uint8_vec_clone
                              (B,&pMVar14[*(uint *)(pMVar14 + uVar11) + uVar11 + 4].unused__);
            if (fVar4 == 0) {
              return 0;
            }
            pfVar12 = flatcc_builder_table_add_offset(B,1);
            if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
              return 0;
            }
            *pfVar12 = fVar4;
            lVar9 = -(long)*(int *)pMVar14;
            uVar13 = *(ushort *)(pMVar14 + -(long)*(int *)pMVar14);
          }
          if ((9 < uVar13) && (uVar11 = (ulong)*(ushort *)(pMVar14 + lVar9 + 8), uVar11 != 0)) {
            fVar4 = flatbuffers_uint8_vec_clone
                              (B,&pMVar14[*(uint *)(pMVar14 + uVar11) + uVar11 + 4].unused__);
            if (fVar4 == 0) {
              return 0;
            }
            pfVar12 = flatcc_builder_table_add_offset(B,2);
            if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
              return 0;
            }
            *pfVar12 = fVar4;
          }
        }
      }
      iVar3 = flatcc_builder_check_required(B,__MyGame_Example_TestBase64_required,0);
      if (iVar3 == 0) {
        __assert_fail("flatcc_builder_check_required(B, __MyGame_Example_TestBase64_required, sizeof(__MyGame_Example_TestBase64_required) / sizeof(__MyGame_Example_TestBase64_required[0]) - 1)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O2/test/monster_test/generated/monster_test_builder.h"
                      ,0x13f,
                      "MyGame_Example_TestBase64_ref_t MyGame_Example_TestBase64_end(flatbuffers_builder_t *)"
                     );
      }
      fVar2 = flatcc_builder_end_table(B);
      fVar2 = flatcc_builder_refmap_insert(B,pMVar14,fVar2);
      if (fVar2 == 0) {
        return 0;
      }
    }
    pfVar12 = flatcc_builder_table_add_offset(B,0x23);
    if (pfVar12 == (flatcc_builder_ref_t *)0x0) {
      return 0;
    }
    *pfVar12 = fVar2;
    lVar9 = -(long)*(int *)t;
  }
  if ((9 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 8) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,2,t + *(ushort *)(t + lVar9 + 8),2,2);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((7 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 6) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,1,t + *(ushort *)(t + lVar9 + 6),2,2);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if ((0x11 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x10) != 0)) {
    pvVar10 = flatcc_builder_table_add_copy(B,6,t + *(ushort *)(t + lVar9 + 0x10),1,1);
    if (pvVar10 == (void *)0x0) {
      return 0;
    }
    lVar9 = -(long)*(int *)t;
  }
  if (((0x23 < *(ushort *)(t + lVar9)) && (*(ushort *)(t + lVar9 + 0x22) != 0)) &&
     (pvVar10 = flatcc_builder_table_add_copy(B,0xf,t + *(ushort *)(t + lVar9 + 0x22),1,1),
     pvVar10 == (void *)0x0)) {
    return 0;
  }
  MVar6 = MyGame_Example_Monster_end(B);
  fVar2 = flatcc_builder_refmap_insert(B,t,MVar6);
  return fVar2;
}

Assistant:

static MyGame_Example_Monster_ref_t MyGame_Example_Monster_clone(flatbuffers_builder_t *B, MyGame_Example_Monster_table_t t)
{
    __flatbuffers_memoize_begin(B, t);
    if (MyGame_Example_Monster_start(B)
        || MyGame_Example_Monster_pos_pick(B, t)
        || MyGame_Example_Monster_testhashs64_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashu64_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashs64_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testhashu64_fnv1a_pick(B, t)
        || MyGame_Example_Monster_name_pick(B, t)
        || MyGame_Example_Monster_inventory_pick(B, t)
        || MyGame_Example_Monster_testarrayoftables_pick(B, t)
        || MyGame_Example_Monster_testarrayofstring_pick(B, t)
        || MyGame_Example_Monster_testarrayofstring2_pick(B, t)
        || MyGame_Example_Monster_testarrayofbools_pick(B, t)
        || MyGame_Example_Monster_testarrayofsortedstruct_pick(B, t)
        || MyGame_Example_Monster_enemy_pick(B, t)
        || MyGame_Example_Monster_test_pick(B, t)
        || MyGame_Example_Monster_test4_pick(B, t)
        || MyGame_Example_Monster_test5_pick(B, t)
        || MyGame_Example_Monster_testnestedflatbuffer_pick(B, t)
        || MyGame_Example_Monster_testempty_pick(B, t)
        || MyGame_Example_Monster_testhashs32_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashu32_fnv1_pick(B, t)
        || MyGame_Example_Monster_testhashs32_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testhashu32_fnv1a_pick(B, t)
        || MyGame_Example_Monster_testf_pick(B, t)
        || MyGame_Example_Monster_testf2_pick(B, t)
        || MyGame_Example_Monster_testf3_pick(B, t)
        || MyGame_Example_Monster_flex_pick(B, t)
        || MyGame_Example_Monster_vector_of_longs_pick(B, t)
        || MyGame_Example_Monster_vector_of_doubles_pick(B, t)
        || MyGame_Example_Monster_parent_namespace_test_pick(B, t)
        || MyGame_Example_Monster_testbase64_pick(B, t)
        || MyGame_Example_Monster_hp_pick(B, t)
        || MyGame_Example_Monster_mana_pick(B, t)
        || MyGame_Example_Monster_color_pick(B, t)
        || MyGame_Example_Monster_testbool_pick(B, t)) {
        return 0;
    }
    __flatbuffers_memoize_end(B, t, MyGame_Example_Monster_end(B));
}